

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O2

void __thiscall
RenX::BanDatabase::process_data(BanDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string> *this_00;
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint16_t *puVar4;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> _Var5;
  mapped_type *this_01;
  uint8_t **ppuVar6;
  uint8_t **extraout_RDX;
  uint8_t **head;
  uint8_t **head_00;
  uint8_t **head_01;
  uint8_t **extraout_RDX_00;
  uint8_t **head_02;
  uint8_t **extraout_RDX_01;
  long lVar7;
  bool bVar8;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (2 < this->m_read_version) {
    std::make_unique<RenX::BanDatabase::Entry>();
    ((local_78._M_head_impl)->pos).__pos = pos.__pos;
    ((local_78._M_head_impl)->pos).__state = pos.__state;
    this_00 = (_Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>
               *)(buffer + 8);
    puVar4 = *(uint16_t **)(buffer + 8);
    uVar2 = *puVar4;
    *(uint16_t **)(buffer + 8) = puVar4 + 1;
    (local_78._M_head_impl)->flags = uVar2;
    bVar1 = this->m_read_version;
    ppuVar6 = (uint8_t **)(ulong)CONCAT11((char)(uVar2 >> 8),bVar1);
    ((local_78._M_head_impl)->timestamp).__d.__r = *(long *)(puVar4 + 1) * 1000000000;
    ((local_78._M_head_impl)->length).__r = *(rep *)(puVar4 + 5);
    (local_78._M_head_impl)->steamid = *(uint64_t *)(puVar4 + 9);
    uVar3 = *(uint32_t *)(puVar4 + 0xd);
    *(uint16_t **)(buffer + 8) = puVar4 + 0xf;
    (local_78._M_head_impl)->ip = uVar3;
    uVar2 = puVar4[0xf];
    *(long *)(buffer + 8) = (long)puVar4 + 0x1f;
    (local_78._M_head_impl)->prefix_length = (uint8_t)uVar2;
    if (4 < bVar1) {
      _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
      interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,ppuVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&(local_78._M_head_impl)->hwid,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      ppuVar6 = extraout_RDX;
    }
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,ppuVar6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_78._M_head_impl)->rdns,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,head);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_78._M_head_impl)->name,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,head_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_78._M_head_impl)->banner,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
    interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,head_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(local_78._M_head_impl)->reason,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    lVar7 = **(long **)this_00;
    *(long **)this_00 = *(long **)this_00 + 1;
    ppuVar6 = extraout_RDX_00;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
      interpret<char,std::char_traits<char>,std::allocator<char>>(&local_70,this_00,ppuVar6);
      _Var5._M_head_impl = local_78._M_head_impl;
      _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
      interpret<char,std::char_traits<char>,std::allocator<char>>(&local_50,this_00,head_02);
      this_01 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(_Var5._M_head_impl)->varData,&local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      ppuVar6 = extraout_RDX_01;
    }
    std::
    vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
    ::
    emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
              ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
                *)&this->m_entries,
               (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                *)&local_78);
    std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
    ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 *)&local_78);
  }
  return;
}

Assistant:

void RenX::BanDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos)
{
	if (m_read_version < 3U)
		return; // incompatible database version

	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint16_t>();
	if (m_read_version >= 4U)
	{
		entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
		entry->length = std::chrono::seconds(buffer.pop<uint64_t>());
	}
	else
	{
		entry->timestamp = std::chrono::system_clock::from_time_t(buffer.pop<time_t>());
		entry->length = std::chrono::seconds(static_cast<long long>(buffer.pop<time_t>()));
	}
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	if (m_read_version >= 5U)
		entry->hwid = buffer.pop<std::string>();
	entry->rdns = buffer.pop<std::string>();
	entry->name = buffer.pop<std::string>();
	entry->banner = buffer.pop<std::string>();
	entry->reason = buffer.pop<std::string>();

	// Read varData from buffer to entry
	for (size_t varData_entries = buffer.pop<size_t>(); varData_entries != 0; --varData_entries) {
		entry->varData[buffer.pop<std::string>()] = buffer.pop<std::string>();
	}

	m_entries.push_back(std::move(entry));
}